

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *pcVar2;
  allocator local_109;
  long *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  uint7 uStack_f7;
  undefined8 uStack_f0;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  comment local_68;
  location local_48;
  
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string((string *)&local_c8,(string *)&e->kind);
  local_88 = local_78;
  if (local_c8 == local_b8) {
    uStack_70 = uStack_b0;
  }
  else {
    local_88 = local_c8;
  }
  local_80 = local_c0;
  local_c0 = 0;
  local_b8[0] = 0;
  local_c8 = local_b8;
  poVar1 = std::operator<<(poVar1,(string *)&local_88);
  std::__cxx11::string::string((string *)&local_68,(string *)&e->note);
  poVar1 = operator<<(poVar1,&local_68);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  std::__cxx11::string::string((string *)&local_108,pcVar2,&local_109);
  local_a0 = local_100;
  local_e8 = &local_d8;
  if (local_108 == (long *)&local_f8) {
    uStack_d0 = uStack_f0;
    local_108 = local_e8;
  }
  local_100 = 0;
  local_f8 = 0;
  local_a8 = local_108;
  if (local_108 == local_e8) {
    uStack_90 = uStack_d0;
    local_a8 = &local_98;
  }
  local_e0 = 0;
  local_d8 = (ulong)uStack_f7 << 8;
  local_108 = (long *)&local_f8;
  poVar1 = std::operator<<(poVar1,(string *)&local_a8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}